

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O2

result_type __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>
::putn<pstore::gsl::span<unsigned_char_const,_1l>>
          (writer_base<pstore::serialize::archive::details::database_writer_policy> *this,
          span<const_unsigned_char,__1L> sp)

{
  result_type rVar1;
  type tVar2;
  index_type local_20;
  
  if (this->flushed_ != true) {
    rVar1 = details::database_writer_policy::putn<pstore::gsl::span<unsigned_char_const,_1l>>
                      (&this->policy_,sp);
    local_20 = sp.storage_.super_extent_type<_1L>.size_.size_;
    tVar2 = unsigned_cast<long>(&local_20);
    this->bytes_consumed_ = this->bytes_consumed_ + tVar2;
    return (result_type)rVar1.a_;
  }
  assert_failed("!flushed_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0xb5);
}

Assistant:

auto putn (Span sp) -> result_type {
                    using element_type = typename Span::element_type;
                    static_assert (std::is_standard_layout<element_type>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    auto r = putn_helper::template putn<Span> (policy_, sp);
                    bytes_consumed_ += unsigned_cast (sp.size_bytes ());
                    return r;
                }